

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O1

StatusOr<unsigned_long> * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::
ValidateNumberConversion<unsigned_long,double>
          (StatusOr<unsigned_long> *__return_storage_ptr__,_anonymous_namespace_ *this,
          unsigned_long after,double before)

{
  StringPiece error_message;
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  StringPiece error_message_00;
  string local_90;
  Status local_70;
  Status local_48;
  
  auVar2._8_4_ = (int)((ulong)this >> 0x20);
  auVar2._0_8_ = this;
  auVar2._12_4_ = 0x45300000;
  dVar3 = (auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0);
  if ((dVar3 == before) && (!NAN(dVar3) && !NAN(before))) {
    dVar1 = 0.0;
    dVar3 = before;
    if (before != 0.0) {
      dVar3 = *(double *)(&DAT_0035f400 + (ulong)(0.0 < before) * 8);
    }
    if (this != (_anonymous_namespace_ *)0x0) {
      dVar1 = 1.0;
    }
    if ((dVar3 == dVar1) && (!NAN(dVar3) && !NAN(dVar1))) {
      Status::Status(&__return_storage_ptr__->status_);
      Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
      __return_storage_ptr__->value_ = (unsigned_long)this;
      return __return_storage_ptr__;
    }
  }
  DoubleAsString_abi_cxx11_(&local_90,(converter *)this,before);
  error_message.length_ = local_90._M_string_length;
  error_message.ptr_ = local_90._M_dataplus._M_p;
  if ((long)local_90._M_string_length < 0) {
    StringPiece::LogFatalSizeTooBig(local_90._M_string_length,"size_t to int conversion");
  }
  Status::Status(&local_48,INVALID_ARGUMENT,error_message);
  Status::Status(&__return_storage_ptr__->status_);
  if (local_48.error_code_ == OK) {
    error_message_00.length_ = 0x23;
    error_message_00.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_70,INTERNAL,error_message_00);
    Status::operator=(&__return_storage_ptr__->status_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.error_message_._M_dataplus._M_p != &local_70.error_message_.field_2) {
      operator_delete(local_70.error_message_._M_dataplus._M_p);
    }
  }
  else {
    Status::operator=(&__return_storage_ptr__->status_,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.error_message_._M_dataplus._M_p != &local_48.error_message_.field_2) {
    operator_delete(local_48.error_message_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> ValidateNumberConversion(To after, From before) {
  if (after == before &&
      MathUtil::Sign<From>(before) == MathUtil::Sign<To>(after)) {
    return after;
  } else {
    return InvalidArgument(std::is_integral<From>::value
                               ? ValueAsString(before)
                               : std::is_same<From, double>::value
                                     ? DoubleAsString(before)
                                     : FloatAsString(before));
  }
}